

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

int __thiscall QDir::rename(QDir *this,char *__old,char *__new)

{
  bool bVar1;
  int iVar2;
  char *__new_00;
  long in_FS_OFFSET;
  QFile local_58;
  QMessageLogger local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(long *)(__old + 0x10) == 0) || (*(long *)(__new + 0x10) == 0)) {
    local_48.context.version = 2;
    local_48.context.function._4_4_ = 0;
    local_48.context._4_8_ = 0;
    local_48.context._12_8_ = 0;
    local_48.context.category = "default";
    iVar2 = 0;
    QMessageLogger::warning(&local_48,"QDir::rename: Empty or null file name(s)");
  }
  else {
    local_58.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
         (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    local_58.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
         (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
    filePath((QString *)&local_48,this,(QString *)__old);
    QFile::QFile(&local_58,(QString *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
    bVar1 = QFile::exists(&local_58);
    if (bVar1) {
      filePath((QString *)&local_48,this,(QString *)__new);
      iVar2 = QFile::rename(&local_58,(char *)&local_48,__new_00);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
    }
    else {
      iVar2 = 0;
    }
    QFile::~QFile(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::rename(const QString &oldName, const QString &newName)
{
    if (oldName.isEmpty() || newName.isEmpty()) {
        qWarning("QDir::rename: Empty or null file name(s)");
        return false;
    }

    QFile file(filePath(oldName));
    if (!file.exists())
        return false;
    return file.rename(filePath(newName));
}